

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O3

void __thiscall
gl4cts::ShaderSubroutine::FunctionalTest5::logError
          (FunctionalTest5 *this,GLchar *(*subroutine_names) [2],GLuint *subroutine_combination,
          vec4<float> *input_data,vec4<float> *first_routine_result,
          vec4<float> *second_routine_result,vec4<float> *third_routine_result,
          vec4<unsigned_int> *fourth_routine_result,vec4<float> *first_routine_expected_result,
          vec4<float> *second_routine_expected_result,vec4<float> *third_routine_expected_result,
          vec4<unsigned_int> *fourth_routine_expected_result)

{
  vec4<float> *this_00;
  char *pcVar1;
  int iVar2;
  size_t sVar3;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  double __x_07;
  double __x_08;
  double __x_09;
  double __x_10;
  double __x_11;
  double __x_12;
  double __x_13;
  double __x_14;
  undefined1 local_330 [8];
  _func_int **local_328;
  ios_base local_2b8 [264];
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  
  local_330 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_328,"Error. Invalid result.",0x16);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
  std::ios_base::~ios_base(local_2b8);
  local_330 = (undefined1  [8])((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_328);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,"Function: ",10);
  pcVar1 = (*subroutine_names)[*subroutine_combination];
  iVar2 = (int)(ostringstream *)&local_328;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear(iVar2 + (int)local_328[-3]);
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,pcVar1,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,"( ",2);
  Utils::vec4<float>::log(input_data,__x);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,", ",2);
  this_00 = input_data + 1;
  Utils::vec4<float>::log(this_00,__x_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328," ). Result: ",0xc);
  Utils::vec4<float>::log(first_routine_result,__x_01);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,". Expected: ",0xc);
  Utils::vec4<float>::log(first_routine_expected_result,__x_02);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
  tcu::MessageBuilder::operator=((MessageBuilder *)local_330,(MessageBuilder *)local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,"Function: ",10);
  pcVar1 = subroutine_names[1][subroutine_combination[1]];
  if (pcVar1 == (char *)0x0) {
    std::ios::clear(iVar2 + (int)local_328[-3]);
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,pcVar1,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,"( ",2);
  Utils::vec4<float>::log(input_data,__x_03);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328," ). Result: ",0xc);
  Utils::vec4<float>::log(second_routine_result,__x_04);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,". Expected: ",0xc);
  Utils::vec4<float>::log(second_routine_expected_result,__x_05);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
  tcu::MessageBuilder::operator=((MessageBuilder *)local_330,(MessageBuilder *)local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,"Function: ",10);
  pcVar1 = subroutine_names[2][subroutine_combination[2]];
  if (pcVar1 == (char *)0x0) {
    std::ios::clear(iVar2 + (int)local_328[-3]);
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,pcVar1,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,"( ",2);
  Utils::vec4<float>::log(input_data,__x_06);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,", ",2);
  Utils::vec4<float>::log(this_00,__x_07);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,", ",2);
  Utils::vec4<float>::log(input_data + 2,__x_08);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,"). Result: ",0xb);
  Utils::vec4<float>::log(third_routine_result,__x_09);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,". Expected: ",0xc);
  Utils::vec4<float>::log(third_routine_expected_result,__x_10);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_1b0 + 8));
  tcu::MessageBuilder::operator=((MessageBuilder *)local_330,(MessageBuilder *)local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 8));
  std::ios_base::~ios_base(local_138);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,"Function: ",10);
  pcVar1 = subroutine_names[3][subroutine_combination[3]];
  if (pcVar1 == (char *)0x0) {
    std::ios::clear(iVar2 + (int)local_328[-3]);
  }
  else {
    sVar3 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,pcVar1,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,"( ",2);
  Utils::vec4<float>::log(input_data,__x_11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,", ",2);
  Utils::vec4<float>::log(this_00,__x_12);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,", ",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328," ). Result: ",0xc);
  Utils::vec4<unsigned_int>::log(fourth_routine_result,__x_13);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_328,". Expected: ",0xc);
  Utils::vec4<unsigned_int>::log(fourth_routine_expected_result,__x_14);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_328);
  std::ios_base::~ios_base(local_2b8);
  return;
}

Assistant:

void FunctionalTest5::logError(const glw::GLchar* subroutine_names[4][2], const glw::GLuint subroutine_combination[4],
							   const Utils::vec4<glw::GLfloat>  input_data[3],
							   const Utils::vec4<glw::GLfloat>& first_routine_result,
							   const Utils::vec4<glw::GLfloat>& second_routine_result,
							   const Utils::vec4<glw::GLfloat>& third_routine_result,
							   const Utils::vec4<glw::GLuint>&  fourth_routine_result,
							   const Utils::vec4<glw::GLfloat>& first_routine_expected_result,
							   const Utils::vec4<glw::GLfloat>& second_routine_expected_result,
							   const Utils::vec4<glw::GLfloat>& third_routine_expected_result,
							   const Utils::vec4<glw::GLuint>&  fourth_routine_expected_result) const
{
	m_context.getTestContext().getLog() << tcu::TestLog::Message << "Error. Invalid result."
										<< tcu::TestLog::EndMessage;

	tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

	message << "Function: " << subroutine_names[0][subroutine_combination[0]] << "( ";
	input_data[0].log(message);
	message << ", ";
	input_data[1].log(message);
	message << " ). Result: ";
	first_routine_result.log(message);
	message << ". Expected: ";
	first_routine_expected_result.log(message);

	message << tcu::TestLog::EndMessage;

	message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

	message << "Function: " << subroutine_names[1][subroutine_combination[1]] << "( ";
	input_data[0].log(message);
	message << " ). Result: ";
	second_routine_result.log(message);
	message << ". Expected: ";
	second_routine_expected_result.log(message);

	message << tcu::TestLog::EndMessage;

	message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

	message << "Function: " << subroutine_names[2][subroutine_combination[2]] << "( ";
	input_data[0].log(message);
	message << ", ";
	input_data[1].log(message);
	message << ", ";
	input_data[2].log(message);
	message << "). Result: ";
	third_routine_result.log(message);
	message << ". Expected: ";
	third_routine_expected_result.log(message);

	message << tcu::TestLog::EndMessage;

	message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

	message << "Function: " << subroutine_names[3][subroutine_combination[3]] << "( ";
	input_data[0].log(message);
	message << ", ";
	input_data[1].log(message);
	message << ", ";
	message << " ). Result: ";
	fourth_routine_result.log(message);
	message << ". Expected: ";
	fourth_routine_expected_result.log(message);

	message << tcu::TestLog::EndMessage;
}